

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteComp(FILE *pFile)

{
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,".model Comp\n");
  fprintf((FILE *)pFile,".inputs a b\n");
  fprintf((FILE *)pFile,".outputs x y\n");
  fprintf((FILE *)pFile,".names a b x\n");
  fprintf((FILE *)pFile,"11 1\n");
  fprintf((FILE *)pFile,".names a b y\n");
  fprintf((FILE *)pFile,"1- 1\n");
  fprintf((FILE *)pFile,"-1 1\n");
  fprintf((FILE *)pFile,".end\n");
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Abc_WriteComp( FILE * pFile )
{
    fprintf( pFile, ".model Comp\n" );
    fprintf( pFile, ".inputs a b\n" ); 
    fprintf( pFile, ".outputs x y\n" ); 
    fprintf( pFile, ".names a b x\n" ); 
    fprintf( pFile, "11 1\n" ); 
    fprintf( pFile, ".names a b y\n" ); 
    fprintf( pFile, "1- 1\n" ); 
    fprintf( pFile, "-1 1\n" ); 
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}